

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O1

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  size_t *psVar1;
  _data *p_Var2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  legacy_async_pool *__p;
  _Node *p_Var4;
  shared_ptr<cppcms::application_specific_pool> p;
  unique_lock<std::recursive_mutex> lock;
  intrusive_ptr<cppcms::application> local_98;
  legacy_async_pool *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  shared_ptr<cppcms::application_specific_pool> local_80;
  unique_lock<std::recursive_mutex> local_70;
  attachment local_60;
  
  __p = (legacy_async_pool *)operator_new(0x28);
  local_98.p_ = *(application **)__special_file;
  if (local_98.p_ != (application *)0x0) {
    booster::intrusive_ptr_add_ref(local_98.p_);
  }
  application_specific_pool::application_specific_pool((application_specific_pool *)__p);
  (__p->super_application_specific_pool)._vptr_application_specific_pool =
       (_func_int **)&PTR__application_specific_pool_00288b38;
  __p->my_ = local_98.p_;
  local_90 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cppcms::impl::legacy_async_pool*>
            (&local_88,__p);
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cppcms::impl::legacy_async_pool,cppcms::impl::legacy_async_pool>
            ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)&local_90
             ,__p);
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_98);
  ((local_90->super_application_specific_pool).d.ptr_)->size = (long)((this->d).ptr_)->thread_count;
  application_specific_pool::flags(&local_90->super_application_specific_pool,0x8001);
  local_70._M_device = &((this->d).ptr_)->lock;
  local_70._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_70);
  local_70._M_owns = true;
  p_Var2 = (this->d).ptr_;
  local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = &local_90->super_application_specific_pool;
  local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_88._M_pi;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
    }
  }
  _data::attachment::attachment(&local_60,&local_80,(mount_point *)__dir);
  p_Var4 = std::__cxx11::
           list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
           ::_M_create_node<cppcms::applications_pool::_data::attachment>
                     (&p_Var2->legacy_async_apps,&local_60);
  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
  psVar1 = &(p_Var2->legacy_async_apps).
            super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_60.pool.
      super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.pool.
               super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  mount_point::~mount_point(&local_60.mp);
  if (local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.
               super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_70);
  iVar3 = extraout_EAX;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
    iVar3 = extraout_EAX_00;
  }
  return iVar3;
}

Assistant:

void applications_pool::mount(booster::intrusive_ptr<application> app,mount_point const &mp)
{
	booster::shared_ptr<application_specific_pool> p(new impl::legacy_async_pool(app));
	p->size(d->thread_count);
	p->flags(app::legacy | app::asynchronous);

	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	d->legacy_async_apps.push_back(_data::attachment(p,mp));
}